

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcAnd.c
# Opt level: O1

int Gia_ManBmcPerform_Unr(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  Bmc_Mna_t *p;
  Gia_Man_t *pFrames;
  undefined4 extraout_var;
  Gia_Man_t *pGVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  double dVar18;
  int Lit;
  ulong local_80;
  Gia_Man_t *local_78;
  int local_6c;
  uint local_68;
  uint local_64;
  Unr_Man_t *local_60;
  timespec ts;
  
  iVar9 = pPars->nFramesMax;
  p = Bmc_MnaAlloc();
  local_78 = pGia;
  local_60 = Unr_ManUnrollStart(pGia,pPars->fVeryVerbose);
  iVar11 = iVar9;
  if (iVar9 < 1) {
    iVar11 = 0;
  }
  local_6c = 1000000000;
  if (iVar9 != 0) {
    local_6c = iVar11;
  }
  uVar14 = 0;
  uVar13 = 0;
  do {
    iVar9 = (int)uVar13;
    if (iVar9 == local_6c) {
      uVar8 = 0xfffffffe;
      goto LAB_005665fc;
    }
    pFrames = Unr_ManUnrollFrame(local_60,iVar9);
    pGVar10 = local_78;
    p->pFrames = pFrames;
    iVar11 = local_78->vCos->nSize - local_78->nRegs;
    uVar17 = iVar9 + 1;
    iVar11 = Gia_ManBmcCheckOutputs(pFrames,iVar11 * iVar9,iVar11 * uVar17);
    local_80 = uVar13;
    if (iVar11 == 0) {
      iVar11 = pGVar10->vCos->nSize - pGVar10->nRegs;
      Gia_ManBmcAddCone(p,iVar11 * iVar9,iVar11 * uVar17);
      Gia_ManBmcAddCnf(p,p->pFrames,p->vInputs,p->vNodes,p->vOutputs);
      iVar11 = pGVar10->vCos->nSize - pGVar10->nRegs;
      uVar14 = (ulong)(uint)(iVar11 * iVar9);
      uVar8 = 0xfffffffe;
      if (iVar11 * iVar9 < (int)(iVar11 * uVar17)) {
        uVar15 = iVar11 * (int)local_80;
        uVar14 = (ulong)uVar15;
        do {
          pGVar10 = p->pFrames;
          iVar9 = pGVar10->vCos->nSize;
          if (iVar9 - pGVar10->nRegs <= (int)uVar14) {
            __assert_fail("v < Gia_ManPoNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d5,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
          }
          if (((int)uVar15 < 0) || (iVar9 <= (int)uVar14)) {
LAB_00566687:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar9 = pGVar10->vCos->pArray[uVar14];
          lVar16 = (long)iVar9;
          if ((lVar16 < 0) || (pGVar10->nObjs <= iVar9)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar1 = pGVar10->pObjs + lVar16;
          uVar12 = (uint)*(undefined8 *)pGVar1;
          bVar6 = true;
          if (pGVar10->pObjs !=
              (Gia_Obj_t *)
              ((ulong)(uVar12 >> 0x1d & 1) ^ (ulong)(pGVar1 + -(ulong)(uVar12 & 0x1fffffff)))) {
            if (pGVar10->nObjs <= iVar9) {
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
            if (p->vId2Var->nSize <= iVar9) goto LAB_00566687;
            iVar9 = p->vId2Var->pArray[lVar16];
            if (iVar9 < 0) {
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            Lit = iVar9 * 2;
            iVar9 = sat_solver_solve(p->pSat,&Lit,(lit *)&local_80,(long)pPars->nConfLimit,0,0,0);
            if (iVar9 != -1) {
              if (iVar9 == 1) {
                uVar8 = 0;
              }
              bVar6 = false;
              uVar8 = uVar8 | -(uint)(iVar9 == 0);
            }
          }
        } while ((bVar6) &&
                (uVar14 = uVar14 + 1,
                (int)uVar14 < (int)((local_78->vCos->nSize - local_78->nRegs) * uVar17)));
      }
    }
    else {
      uVar8 = 0xfffffffe;
    }
    if (pPars->fVerbose != 0) {
      pGVar10 = p->pFrames;
      iVar9 = pGVar10->vCis->nSize;
      iVar11 = pGVar10->nRegs;
      iVar2 = pGVar10->vCos->nSize;
      iVar3 = pGVar10->nObjs;
      iVar4 = p->nSatVars;
      local_68 = p->vInputs->nSize;
      uVar15 = p->vNodes->nSize;
      local_64 = uVar8;
      iVar7 = sat_solver_nclauses(p->pSat);
      uVar8 = sat_solver_nconflicts(p->pSat);
      dVar18 = Gia_ManMemory(p->pFrames);
      printf("%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   "
             ,dVar18 * 9.5367431640625e-07,local_80,(ulong)(uint)(iVar9 - iVar11),
             (ulong)(uint)(~(iVar9 + iVar2) + iVar3),(ulong)(iVar4 - 1),(ulong)local_68,
             (ulong)uVar15,CONCAT44(extraout_var,iVar7),(ulong)uVar8);
      iVar11 = 3;
      iVar9 = clock_gettime(3,(timespec *)&ts);
      if (iVar9 < 0) {
        lVar16 = -1;
      }
      else {
        lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
      }
      lVar5 = p->clkStart;
      Abc_Print(iVar11,"%s =","Time");
      Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar16 - lVar5) / 1000000.0);
      uVar8 = local_64;
    }
    uVar13 = (ulong)uVar17;
  } while (uVar8 == 0xfffffffe);
  if (uVar8 == 0xffffffff) {
    printf("SAT solver reached conflict/runtime limit in frame %d.\n",local_80);
    uVar8 = 0xffffffff;
  }
  else {
    printf("Output %d of miter \"%s\" was asserted in frame %d.  ",
           (ulong)(uint)((local_78->nRegs - local_78->vCos->nSize) * (int)local_80 + (int)uVar14),
           local_78->pName);
    iVar11 = 3;
    iVar9 = clock_gettime(3,(timespec *)&ts);
    if (iVar9 < 0) {
      lVar16 = -1;
    }
    else {
      lVar16 = ts.tv_nsec / 1000 + ts.tv_sec * 1000000;
    }
    lVar5 = p->clkStart;
    Abc_Print(iVar11,"%s =","Time");
    Abc_Print(iVar11,"%9.2f sec\n",(double)(lVar16 - lVar5) / 1000000.0);
  }
LAB_005665fc:
  if (pPars->fDumpFrames != 0) {
    pGVar10 = Gia_ManCleanup(p->pFrames);
    p->pFrames = pGVar10;
    Gia_AigerWrite(pGVar10,"frames.aig",0,0,0);
    puts("Dumped unfolded frames into file \"frames.aig\".");
    Gia_ManStop(p->pFrames);
  }
  uVar17 = 0xffffffff;
  if (uVar8 != 0xfffffffe) {
    uVar17 = uVar8;
  }
  Unr_ManFree(local_60);
  Bmc_MnaFree(p);
  return uVar17;
}

Assistant:

int Gia_ManBmcPerform_Unr( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Unr_Man_t * pUnroll;
    Bmc_Mna_t * p;
    int nFramesMax = pPars->nFramesMax ? pPars->nFramesMax : ABC_INFINITY;
    int f, i=0, Lit, status, RetValue = -2;
    p = Bmc_MnaAlloc();
    pUnroll = Unr_ManUnrollStart( pGia, pPars->fVeryVerbose );
    for ( f = 0; f < nFramesMax; f++ )
    {
        p->pFrames = Unr_ManUnrollFrame( pUnroll, f );
        if ( !Gia_ManBmcCheckOutputs( p->pFrames, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) ) )
        {
            // create another slice
            Gia_ManBmcAddCone( p, f * Gia_ManPoNum(pGia), (f+1) * Gia_ManPoNum(pGia) );
            // create CNF in the SAT solver
            Gia_ManBmcAddCnf( p, p->pFrames, p->vInputs, p->vNodes, p->vOutputs );
            // try solving the outputs
            for ( i = f * Gia_ManPoNum(pGia); i < (f+1) * Gia_ManPoNum(pGia); i++ )
            {
                Gia_Obj_t * pObj = Gia_ManPo(p->pFrames, i);
                if ( Gia_ObjChild0(pObj) == Gia_ManConst0(p->pFrames) )
                    continue;
                Lit = Abc_Var2Lit( Vec_IntEntry(p->vId2Var, Gia_ObjId(p->pFrames, pObj)), 0 );
                status = sat_solver_solve( p->pSat, &Lit, &Lit + 1, (ABC_INT64_T)pPars->nConfLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
                if ( status == l_False ) // unsat
                    continue;
                if ( status == l_True ) // sat
                    RetValue = 0;
                if ( status == l_Undef ) // undecided
                    RetValue = -1;
                break;
            }
        }
        // report statistics
        if ( pPars->fVerbose )
        {
            printf( "%4d :  PI =%9d.  AIG =%9d.  Var =%8d.  In =%6d.  And =%9d.  Cla =%9d.  Conf =%9d.  Mem =%7.1f MB   ", 
                f, Gia_ManPiNum(p->pFrames), Gia_ManAndNum(p->pFrames), 
                p->nSatVars-1, Vec_IntSize(p->vInputs), Vec_IntSize(p->vNodes), 
                sat_solver_nclauses(p->pSat), sat_solver_nconflicts(p->pSat), Gia_ManMemory(p->pFrames)/(1<<20) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
        }
        if ( RetValue != -2 )
        {
            if ( RetValue == -1 )
                printf( "SAT solver reached conflict/runtime limit in frame %d.\n", f );
            else
            {
                printf( "Output %d of miter \"%s\" was asserted in frame %d.  ", 
                    i - f * Gia_ManPoNum(pGia), Gia_ManName(pGia), f );
                Abc_PrintTime( 1, "Time", Abc_Clock() - p->clkStart );
            }
            break;
        }
    }
    if ( RetValue == -2 )
        RetValue = -1;
    // dump unfolded frames
    if ( pPars->fDumpFrames )
    {
        p->pFrames = Gia_ManCleanup( p->pFrames );
        Gia_AigerWrite( p->pFrames, "frames.aig", 0, 0, 0 );
        printf( "Dumped unfolded frames into file \"frames.aig\".\n" );
        Gia_ManStop( p->pFrames );
    }
    // cleanup
    Unr_ManFree( pUnroll );
    Bmc_MnaFree( p );
    return RetValue;
}